

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O3

shared_ptr<Node>
ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
          (__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *current,
          __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> end,
          uint precedence)

{
  Token *pTVar1;
  pair<const_LogicalOperation,_unsigned_int> pVar2;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> _Var3;
  undefined1 auVar4 [8];
  int iVar5;
  mapped_type *pmVar6;
  logic_error *plVar7;
  uint in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  shared_ptr<Node> sVar10;
  initializer_list<std::pair<const_LogicalOperation,_unsigned_int>_> __l;
  LogicalOperation logical_operation;
  map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
  precedences;
  undefined1 local_8d;
  key_type local_8c;
  pair<const_LogicalOperation,_unsigned_int> local_88;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> _Stack_80;
  undefined1 local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  shared_ptr<Node> local_40;
  
  _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,precedence);
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((end._M_current)->value)._M_dataplus._M_p;
  current->_M_current = (Token *)0x0;
  current[1]._M_current = (Token *)0x0;
  if (p_Var9 != _Var8._M_pi) {
    if (*(int *)&p_Var9[2]._vptr__Sp_counted_base == 5) {
      ((end._M_current)->value)._M_dataplus._M_p = (pointer)&p_Var9[2]._M_use_count;
      ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_78
                 ,end,precedence);
      p_Var9 = p_Stack_70;
      auVar4 = local_78;
      local_78 = (undefined1  [8])0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pTVar1 = current[1]._M_current;
      current->_M_current = (Token *)auVar4;
      current[1]._M_current = (Token *)p_Var9;
      if ((pTVar1 != (Token *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1),
         p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((end._M_current)->value)._M_dataplus._M_p;
      if ((p_Var9 == _Var8._M_pi) || (*(int *)&p_Var9[2]._vptr__Sp_counted_base != 6)) {
        plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar7,"Missing right paren");
        __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      ((end._M_current)->value)._M_dataplus._M_p = (pointer)&p_Var9[2]._M_use_count;
    }
    else {
      ParseComparison<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)local_78
                 ,end);
      p_Var9 = p_Stack_70;
      auVar4 = local_78;
      local_78 = (undefined1  [8])0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pTVar1 = current[1]._M_current;
      current->_M_current = (Token *)auVar4;
      current[1]._M_current = (Token *)p_Var9;
      if ((pTVar1 != (Token *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1),
         p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
    }
    local_88.first = Or;
    local_88.second = 1;
    _Stack_80._M_current = (Token *)0x200000001;
    __l._M_len = 2;
    __l._M_array = &local_88;
    std::
    map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::map((map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
           *)local_78,__l,(less<LogicalOperation> *)&local_40,(allocator_type *)&local_8c);
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((end._M_current)->value)._M_dataplus._M_p;
    if (p_Var9 != _Var8._M_pi) {
      do {
        if (*(int *)&p_Var9[2]._vptr__Sp_counted_base != 3) {
          if (*(int *)&p_Var9[2]._vptr__Sp_counted_base != 6) {
            plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar7,"Expected logic operation");
            __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          break;
        }
        iVar5 = std::__cxx11::string::compare((char *)p_Var9);
        local_8c = (key_type)(iVar5 == 0);
        pmVar6 = std::
                 map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
                 ::at((map<LogicalOperation,_unsigned_int,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
                       *)local_78,&local_8c);
        if (*pmVar6 <= in_ECX) break;
        ((end._M_current)->value)._M_dataplus._M_p =
             ((end._M_current)->value)._M_dataplus._M_p + 0x28;
        ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
                  ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)
                   &local_40,end,precedence);
        local_88.first = Or;
        local_88.second = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<LogicalOperationNode,std::allocator<LogicalOperationNode>,LogicalOperation_const&,std::shared_ptr<Node>&,std::shared_ptr<Node>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_80,
                   (LogicalOperationNode **)&local_88,(allocator<LogicalOperationNode> *)&local_8d,
                   &local_8c,(shared_ptr<Node> *)current,&local_40);
        _Var3._M_current = _Stack_80._M_current;
        pVar2 = local_88;
        local_88.first = Or;
        local_88.second = 0;
        _Stack_80._M_current = (Token *)0x0;
        pTVar1 = current[1]._M_current;
        current->_M_current = (Token *)pVar2;
        current[1]._M_current = _Var3._M_current;
        if ((pTVar1 != (Token *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1),
           _Stack_80._M_current != (Token *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_80._M_current);
        }
        if (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    );
        }
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((end._M_current)->value)._M_dataplus._M_p;
      } while (p_Var9 != _Var8._M_pi);
    }
    std::
    _Rb_tree<LogicalOperation,_std::pair<const_LogicalOperation,_unsigned_int>,_std::_Select1st<std::pair<const_LogicalOperation,_unsigned_int>_>,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<LogicalOperation,_std::pair<const_LogicalOperation,_unsigned_int>,_std::_Select1st<std::pair<const_LogicalOperation,_unsigned_int>_>,_std::less<LogicalOperation>,_std::allocator<std::pair<const_LogicalOperation,_unsigned_int>_>_>
                 *)local_78);
    _Var8._M_pi = extraout_RDX;
  }
  sVar10.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar10.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)current;
  return (shared_ptr<Node>)sVar10.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Node> ParseExpression(It& current, It end, unsigned precedence) {
    if (current == end) {
        return shared_ptr<Node>();
    }

    shared_ptr<Node> left;

    if (current->type == TokenType::PAREN_LEFT) {
        ++current; // consume '('
        left = ParseExpression(current, end, 0u);
        if (current == end || current->type != TokenType::PAREN_RIGHT) {
            throw logic_error("Missing right paren");
        }
        ++current; // consume ')'
    } else {
        left = ParseComparison(current, end);
    }

    const map<LogicalOperation, unsigned> precedences = {
        {LogicalOperation::Or, 1},
        {LogicalOperation::And, 2}
    };

    while (current != end && current->type != TokenType::PAREN_RIGHT) {
        if (current->type != TokenType::LOGICAL_OP) {
            throw logic_error("Expected logic operation");
        }

        const auto logical_operation = current->value == "AND" ? LogicalOperation::And
                                                            : LogicalOperation::Or;
        const auto current_precedence = precedences.at(logical_operation);
        if (current_precedence <= precedence) {
            break;
        }

        ++current; // consume op

        left = make_shared<LogicalOperationNode>(
            logical_operation, left, ParseExpression(current, end, current_precedence)
        );
    }

    return left;
}